

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_inline.h
# Opt level: O2

_Bool xdr_opaque_auth_decode(XDR *xdrs,opaque_auth *oa,int32_t *buf)

{
  _Bool _Var1;
  undefined8 uVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  char local_24 [4];
  
  if (buf == (int32_t *)0x0) {
    _Var1 = xdr_getuint32(xdrs,(uint32_t *)oa);
    if (!_Var1) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar5 = "%s:%u ERROR oa_flavor";
      pcVar4 = "xdr_opaque_auth_decode";
      uVar2 = 0x87;
      goto LAB_0010f961;
    }
    _Var1 = xdr_getuint32(xdrs,&oa->oa_length);
    if (!_Var1) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar5 = "%s:%u ERROR oa_length";
      pcVar4 = "xdr_opaque_auth_decode";
      uVar2 = 0x8c;
      goto LAB_0010f961;
    }
    uVar3 = oa->oa_length;
  }
  else {
    uVar3 = *buf;
    oa->oa_flavor = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar3 = buf[1];
    uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    oa->oa_length = uVar3;
  }
  if (uVar3 == 0) {
    return true;
  }
  if (uVar3 < 0x191) {
    _Var1 = (*xdrs->x_ops->x_getbytes)(xdrs,oa->oa_body,uVar3);
    if (_Var1) {
      if ((uVar3 & 3) == 0) {
        return true;
      }
      _Var1 = (*xdrs->x_ops->x_getbytes)(xdrs,local_24,4 - (uVar3 & 3));
      if (_Var1) {
        return true;
      }
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR crud","xdr_opaque_decode",0x1c9);
      }
    }
    else if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      pcVar5 = "%s:%u ERROR opaque";
      pcVar4 = "xdr_opaque_decode";
      uVar2 = 0x1b9;
LAB_0010f961:
      (*__ntirpc_pkg_params.warnx_)(pcVar5,pcVar4,uVar2);
      return false;
    }
  }
  else if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
    (*__ntirpc_pkg_params.warnx_)
              ("%s:%u ERROR oa_length (%u) > %u","xdr_opaque_auth_decode_it",0x70,(ulong)uVar3,400);
    return false;
  }
  return false;
}

Assistant:

static inline bool
xdr_opaque_auth_decode(XDR *xdrs, struct opaque_auth *oa, int32_t *buf)
{
	if (buf != NULL) {
		oa->oa_flavor = IXDR_GET_ENUM(buf, enum_t);
		oa->oa_length = (u_int) IXDR_GET_U_INT32(buf);
	} else if (!xdr_getenum(xdrs, (enum_t *)&oa->oa_flavor)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR oa_flavor",
			__func__, __LINE__);
		return (false);
	} else if (!xdr_getuint32(xdrs, &oa->oa_length)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR oa_length",
			__func__, __LINE__);
		return (false);
	}

	if (oa->oa_length) {
		/* only call and alloc for > 0 length */
		return xdr_opaque_auth_decode_it(xdrs, oa);
	}
	return (true);	/* 0 length succeeds */
}